

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_gtar_filename.c
# Opt level: O2

void test_read_format_gtar_filename_KOI8R_CP1251(void)

{
  int iVar1;
  wchar_t wVar2;
  char *pcVar3;
  archive_conflict *a;
  la_int64_t lVar4;
  archive_entry *ae;
  
  pcVar3 = setlocale(6,"Russian_Russia");
  if (pcVar3 == (char *)0x0) {
    pcVar3 = setlocale(6,"ru_RU.CP1251");
    if (pcVar3 == (char *)0x0) {
      skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                     ,L'ǋ');
      test_skipping("CP1251 locale not available on this system.");
      return;
    }
  }
  extract_reference_file("test_read_format_gtar_filename_koi8r.tar.Z");
  a = (archive_conflict *)archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                   ,L'ǐ',(uint)(a != (archive_conflict *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_read_support_filter_all((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                      ,L'Ǒ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",a);
  iVar1 = archive_read_support_format_all((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                      ,L'ǒ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",a);
  iVar1 = archive_read_set_options((archive *)a,"hdrcharset=KOI8-R");
  if (iVar1 == 0) {
    wVar2 = archive_read_open_filename(a,"test_read_format_gtar_filename_koi8r.tar.Z",0x2800);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                        ,L'Ǚ',0,"ARCHIVE_OK",(long)wVar2,
                        "archive_read_open_filename(a, refname, 10240)",a);
    iVar1 = archive_read_next_header((archive *)a,&ae);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                        ,L'ǜ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",a);
    pcVar3 = archive_entry_pathname(ae);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
               ,L'Ǟ',anon_var_dwarf_6b791,"\"\\xef\\xf0\\xe8\\xe2\\xe5\\xf2\"",pcVar3,
               "archive_entry_pathname(ae)",(void *)0x0,L'\0');
    lVar4 = archive_entry_size(ae);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                        ,L'ǟ',6,"6",lVar4,"archive_entry_size(ae)",(void *)0x0);
    iVar1 = archive_read_next_header((archive *)a,&ae);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                        ,L'Ǣ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",a);
    pcVar3 = archive_entry_pathname(ae);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
               ,L'Ǥ',anon_var_dwarf_6b77b,"\"\\xcf\\xd0\\xc8\\xc2\\xc5\\xd2\"",pcVar3,
               "archive_entry_pathname(ae)",(void *)0x0,L'\0');
    lVar4 = archive_entry_size(ae);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                        ,L'ǥ',6,"6",lVar4,"archive_entry_size(ae)",(void *)0x0);
    iVar1 = archive_read_next_header((archive *)a,&ae);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                        ,L'ǩ',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",a);
    iVar1 = archive_filter_code((archive *)a,0);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                        ,L'Ǭ',3,"ARCHIVE_FILTER_COMPRESS",(long)iVar1,"archive_filter_code(a, 0)",a
                       );
    iVar1 = archive_format((archive *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                        ,L'ǭ',0x30004,"ARCHIVE_FORMAT_TAR_GNUTAR",(long)iVar1,"archive_format(a)",a
                       );
    iVar1 = archive_read_close((archive *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                        ,L'ǰ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",(void *)0x0);
  }
  else {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                   ,L'ǔ');
    test_skipping("This system cannot convert character-set from KOI8-R to CP1251.");
  }
  iVar1 = archive_read_free((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                      ,L'ǲ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  return;
}

Assistant:

DEFINE_TEST(test_read_format_gtar_filename_KOI8R_CP1251)
{
	const char *refname = "test_read_format_gtar_filename_koi8r.tar.Z";
	struct archive *a;
	struct archive_entry *ae;

	/*
	 * Read KOI8-R filename in CP1251 with "hdrcharset=KOI8-R" option.
	 */
	if (NULL == setlocale(LC_ALL, "Russian_Russia") &&
	    NULL == setlocale(LC_ALL, "ru_RU.CP1251")) {
		skipping("CP1251 locale not available on this system.");
		return;
	}
	extract_reference_file(refname);

	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	if (ARCHIVE_OK != archive_read_set_options(a, "hdrcharset=KOI8-R")) {
		skipping("This system cannot convert character-set"
		    " from KOI8-R to CP1251.");
		goto cleanup;
	}
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_open_filename(a, refname, 10240));

	/* Verify regular file. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString("\xef\xf0\xe8\xe2\xe5\xf2",
	    archive_entry_pathname(ae));
	assertEqualInt(6, archive_entry_size(ae));

	/* Verify regular file. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString("\xcf\xd0\xc8\xc2\xc5\xd2",
	    archive_entry_pathname(ae));
	assertEqualInt(6, archive_entry_size(ae));


	/* End of archive. */
	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));

	/* Verify archive format. */
	assertEqualIntA(a, ARCHIVE_FILTER_COMPRESS, archive_filter_code(a, 0));
	assertEqualIntA(a, ARCHIVE_FORMAT_TAR_GNUTAR, archive_format(a));

	/* Close the archive. */
	assertEqualInt(ARCHIVE_OK, archive_read_close(a));
cleanup:
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}